

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_types.c
# Opt level: O2

void allocateProof2(proof2_t *proof,picnic_instance_t *params)

{
  byte bVar1;
  uint8_t *puVar2;
  
  proof->unOpenedIndex = 0;
  proof->seedInfo = (uint8_t *)0x0;
  proof->seedInfoLen = 0;
  puVar2 = (uint8_t *)malloc((ulong)params->digest_size);
  proof->C = puVar2;
  puVar2 = (uint8_t *)malloc((ulong)params->input_output_size);
  proof->input = puVar2;
  bVar1 = params->view_size;
  puVar2 = (uint8_t *)malloc((ulong)bVar1);
  proof->aux = puVar2;
  puVar2 = (uint8_t *)malloc((ulong)bVar1);
  proof->msgs = puVar2;
  return;
}

Assistant:

void allocateProof2(proof2_t* proof, const picnic_instance_t* params) {
  proof->unOpenedIndex = 0;
  proof->seedInfo      = NULL; // Sign/verify code sets it
  proof->seedInfoLen   = 0;
  proof->C             = malloc(params->digest_size);
  proof->input         = malloc(params->input_output_size);
  proof->aux           = malloc(params->view_size);
  proof->msgs          = malloc(params->view_size);
}